

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall
fizplex::LPTest_GetValueWhenNoValueWasAddedIsZero_Test::TestBody
          (LPTest_GetValueWhenNoValueWasAddedIsZero_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar;
  LP lp;
  double in_stack_000002e0;
  double in_stack_000002e8;
  char *in_stack_000002f0;
  char *in_stack_000002f8;
  double in_stack_ffffffffffffff18;
  LP *in_stack_ffffffffffffff20;
  ColType in_stack_ffffffffffffff2c;
  LP *in_stack_ffffffffffffff30;
  undefined1 *row;
  AssertHelper in_stack_ffffffffffffff40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff48;
  LP *in_stack_ffffffffffffff50;
  RowType in_stack_ffffffffffffff5c;
  LP *in_stack_ffffffffffffff60;
  undefined1 local_90 [144];
  
  row = local_90;
  LP::LP(in_stack_ffffffffffffff50);
  LP::add_column(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 (double)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,9.25742164122598e-318);
  LP::add_row(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(double)in_stack_ffffffffffffff50,
              (double)in_stack_ffffffffffffff48.ptr_);
  LP::get_value((LP *)in_stack_ffffffffffffff40.data_,(size_t)row,(size_t)in_stack_ffffffffffffff30)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff50);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff48);
    in_stack_ffffffffffffff20 =
         (LP *)testing::AssertionResult::failure_message((AssertionResult *)0x1c97f5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x70,(char *)in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&stack0xffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff40);
    testing::Message::~Message((Message *)0x1c9843);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c9883);
  LP::~LP(in_stack_ffffffffffffff20);
  return;
}

Assistant:

TEST(LPTest, GetValueWhenNoValueWasAddedIsZero) {
  LP lp;
  lp.add_column(ColType::Bounded, 0, 5);
  lp.add_row(RowType::Range, 3, 15);
  EXPECT_DOUBLE_EQ(0.0, lp.get_value(0, 0));
}